

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O0

void __thiscall
rsg::
UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::InvSqrtOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::InvSqrtOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::InvSqrtOp>_>
::tokenize(UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::InvSqrtOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::InvSqrtOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::InvSqrtOp>_>
           *this,GeneratorState *state,TokenStream *str)

{
  char *identifier;
  TokenStream *pTVar1;
  Token local_60;
  Token local_50 [2];
  Token local_30;
  TokenStream *local_20;
  TokenStream *str_local;
  GeneratorState *state_local;
  UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::InvSqrtOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::InvSqrtOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::InvSqrtOp>_>
  *this_local;
  
  local_20 = str;
  str_local = (TokenStream *)state;
  state_local = (GeneratorState *)this;
  identifier = (char *)std::__cxx11::string::c_str();
  Token::Token(&local_30,identifier);
  pTVar1 = TokenStream::operator<<(str,&local_30);
  Token::Token(local_50,LEFT_PAREN);
  TokenStream::operator<<(pTVar1,local_50);
  Token::~Token(local_50);
  Token::~Token(&local_30);
  (*this->m_child->_vptr_Expression[3])(this->m_child,str_local,local_20);
  pTVar1 = local_20;
  Token::Token(&local_60,RIGHT_PAREN);
  TokenStream::operator<<(pTVar1,&local_60);
  Token::~Token(&local_60);
  return;
}

Assistant:

void UnaryBuiltinVecFunc<GetValueRangeWeight, ComputeValueRange, Evaluate>::tokenize (GeneratorState& state, TokenStream& str) const
{
	str << Token(m_function.c_str()) << Token::LEFT_PAREN;
	m_child->tokenize(state, str);
	str << Token::RIGHT_PAREN;
}